

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  sockaddr *__addr_00;
  int *piVar3;
  long lVar4;
  undefined4 in_register_00000034;
  fd_set *__arr;
  undefined1 auStack_d8 [4];
  uint __i;
  timeval t;
  fd_set fd_w;
  sockaddr *saddr;
  int local_38;
  int back_err;
  int ret;
  int saveflags;
  int res;
  int len_addr;
  socklen_t len;
  int timeout_local;
  Address *addr_local;
  Socket *this_local;
  
  _len = (Address *)CONCAT44(in_register_00000034,__fd);
  len_addr = (int)__addr;
  res = 0;
  saveflags = 0;
  ret = 0;
  addr_local = (Address *)this;
  __addr_00 = Address::getAddr(_len,&saveflags);
  _auStack_d8 = (long)len_addr;
  t.tv_sec = 0;
  back_err = fcntl(this->mFd,3,0);
  if (back_err < 0) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = fcntl(this->mFd,4,(ulong)(back_err | 0x800));
    if (iVar1 < 0) {
      this_local._4_4_ = -1;
    }
    else {
      ret = ::connect(this->mFd,(sockaddr *)__addr_00,saveflags);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      iVar2 = fcntl(this->mFd,4,(ulong)(uint)back_err);
      if (iVar2 < 0) {
        this_local._4_4_ = -1;
      }
      else if ((ret < 0) && (iVar1 != 0x73)) {
        this_local._4_4_ = -1;
      }
      else {
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          fd_w.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
        }
        lVar4 = (long)(this->mFd / 0x40);
        fd_w.fds_bits[lVar4 + -1] =
             1L << ((byte)((long)this->mFd % 0x40) & 0x3f) | fd_w.fds_bits[lVar4 + -1];
        ret = select(0x400,(fd_set *)0x0,(fd_set *)&t.tv_usec,(fd_set *)0x0,(timeval *)auStack_d8);
        if (ret < 0) {
          this_local._4_4_ = -1;
        }
        else if (ret == 0) {
          this_local._4_4_ = -1;
        }
        else {
          res = 4;
          ret = getsockopt(this->mFd,1,4,&local_38,(socklen_t *)&res);
          if (ret < 0) {
            this_local._4_4_ = -1;
          }
          else if (local_38 == 0) {
            if (ret == 0) {
              setConnected(this,true,1);
            }
            this_local._4_4_ = ret;
          }
          else {
            this_local._4_4_ = -1;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Socket::connect( const Socket::Address &addr, int timeout )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	socklen_t len = 0;
	int len_addr = 0;
	int res = 0;
	int saveflags, ret, back_err;
	const struct sockaddr *saddr = addr.getAddr( len_addr );
	fd_set fd_w;
	struct timeval t;

	t.tv_sec = timeout;
	t.tv_usec = 0;

	saveflags=fcntl(mFd,F_GETFL,0);

	if( saveflags < 0 ) {
		return -1;
	}

	/* Set non blocking */
	if(fcntl(mFd,F_SETFL,saveflags|O_NONBLOCK)<0) {
		return -1;
	}

	/* This will return immediately */
	res = ::connect( mFd, saddr, len_addr );
	back_err=errno;

	/* restore flags */
	if(fcntl(mFd,F_SETFL,saveflags)<0) {
		return -1;
	}

	/* return unless the connection was successful or the connect is
	still in progress. */
	if(res<0 && back_err!=EINPROGRESS) {
		return -1;
	}

	FD_ZERO(&fd_w);
	FD_SET(mFd,&fd_w);

	res=select(FD_SETSIZE,NULL,&fd_w,NULL,&t);

	if(res < 0) {
		return -1;
	}

	/* 0 means it timeout out & no fds changed */
	if( res == 0 ) {
		return -1;
	}

	/* Get the return code from the connect */
	len=sizeof(ret);
	res=getsockopt(mFd,SOL_SOCKET,SO_ERROR,&ret,&len);
	if(res<0) {
		return -1;
	}

	/* ret=0 means success, otherwise it contains the errno */
	if(ret) {
		return -1;
	}

	LOG_NOTICE( "connect to %s on port %d", addr.getName(), addr.getPort() );

	if ( res == 0 )
		setConnected( true );

	return res;
}